

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

aiScene * __thiscall Assimp::BatchLoader::GetImport(BatchLoader *this,uint which)

{
  int *piVar1;
  aiScene *paVar2;
  list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_> *plVar3;
  const_iterator __position;
  
  plVar3 = &this->m_data->requests;
  __position._M_node = (_List_node_base *)plVar3;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)plVar3) {
      return (aiScene *)0x0;
    }
  } while ((*(uint *)&__position._M_node[0x10]._M_prev != which) ||
          (*(char *)&__position._M_node[4]._M_next != '\x01'));
  paVar2 = (aiScene *)__position._M_node[3]._M_prev;
  piVar1 = (int *)((long)&__position._M_node[3]._M_next + 4);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::erase
              (&this->m_data->requests,__position);
  }
  return paVar2;
}

Assistant:

aiScene* BatchLoader::GetImport( unsigned int which )
{
    for ( LoadReqIt it = m_data->requests.begin();it != m_data->requests.end(); ++it) {
        if ((*it).id == which && (*it).loaded)  {
            aiScene* sc = (*it).scene;
            if (!(--(*it).refCnt))  {
                m_data->requests.erase(it);
            }
            return sc;
        }
    }
    return nullptr;
}